

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout.c
# Opt level: O3

void ourWriteOut(CURL *curl,OutStruct *outs,char *writeinfo)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  long lVar4;
  int iVar5;
  char *pcVar6;
  undefined8 *puVar7;
  long lVar8;
  variable *pvVar9;
  byte *pbVar10;
  char *pcVar11;
  undefined8 uVar12;
  int __c;
  FILE *pFVar13;
  FILE *__stream;
  double doubleinfo;
  long longinfo;
  char *stringp;
  undefined8 local_50;
  byte *local_48;
  byte *local_40;
  OutStruct *local_38;
  
  local_40 = (byte *)0x0;
  __stream = _stdout;
  local_38 = outs;
  if (writeinfo != (char *)0x0) {
LAB_0011c7dc:
    while( true ) {
      for (writeinfo = (char *)((byte *)writeinfo + 1); bVar1 = ((byte *)writeinfo)[-1],
          bVar1 == 0x25; writeinfo = (char *)((byte *)writeinfo + 2)) {
        bVar2 = *writeinfo;
        if (bVar2 != 0x7b) {
          if (bVar2 == 0) goto LAB_0011c871;
          iVar5 = 0x25;
          __c = 0x25;
          if (bVar2 == 0x25) goto LAB_0011c861;
          goto LAB_0011c855;
        }
        pcVar6 = strchr((char *)((byte *)writeinfo + -1),0x7d);
        if (pcVar6 != (char *)0x0) {
          cVar3 = *pcVar6;
          *pcVar6 = '\0';
          pbVar10 = (byte *)writeinfo + 1;
          iVar5 = curl_strequal(pbVar10,"url_effective");
          pvVar9 = replacements;
          if (iVar5 != 0) goto LAB_0011c8e4;
          lVar4 = 0;
          goto LAB_0011c8ae;
        }
        fputs("%{",__stream);
      }
      if (bVar1 == 0) break;
      if (bVar1 == 0x5c) {
        bVar1 = *writeinfo;
        if (bVar1 < 0x72) {
          if (bVar1 == 0) {
            iVar5 = 0x5c;
            goto LAB_0011c874;
          }
          if (bVar1 == 0x6e) {
            iVar5 = 10;
          }
          else {
LAB_0011c928:
            __c = 0x5c;
LAB_0011c855:
            fputc(__c,__stream);
            iVar5 = (int)*writeinfo;
          }
        }
        else if (bVar1 == 0x72) {
          iVar5 = 0xd;
        }
        else {
          if (bVar1 != 0x74) goto LAB_0011c928;
          iVar5 = 9;
        }
LAB_0011c861:
        fputc(iVar5,__stream);
        writeinfo = (char *)((byte *)writeinfo + 1);
      }
      else {
LAB_0011c871:
        iVar5 = (int)(char)bVar1;
LAB_0011c874:
        fputc(iVar5,__stream);
      }
    }
  }
  return;
  while (iVar5 = curl_strequal(pbVar10,*(undefined8 *)((long)&replacements[1].name + lVar8)),
        lVar4 = lVar8 + 0x10, iVar5 == 0) {
LAB_0011c8ae:
    lVar8 = lVar4;
    if (lVar8 + 0x10 == 0x210) {
      pcVar11 = "curl: unknown --write-out variable: \'%s\'\n";
      pFVar13 = _stderr;
      goto LAB_0011cc71;
    }
  }
  pvVar9 = (variable *)(lVar8 + 0x12bb50);
LAB_0011c8e4:
  pFVar13 = __stream;
  switch(pvVar9->id) {
  case VAR_TOTAL_TIME:
    uVar12 = 0x300003;
    goto LAB_0011ca8c;
  case VAR_NAMELOOKUP_TIME:
    uVar12 = 0x300004;
    goto LAB_0011ca8c;
  case VAR_CONNECT_TIME:
    uVar12 = 0x300005;
    goto LAB_0011ca8c;
  case VAR_APPCONNECT_TIME:
    uVar12 = 0x300021;
    goto LAB_0011ca8c;
  case VAR_PRETRANSFER_TIME:
    uVar12 = 0x300006;
    goto LAB_0011ca8c;
  case VAR_STARTTRANSFER_TIME:
    uVar12 = 0x300011;
    goto LAB_0011ca8c;
  case VAR_SIZE_DOWNLOAD:
    uVar12 = 0x300008;
    goto LAB_0011cade;
  case VAR_SIZE_UPLOAD:
    uVar12 = 0x300007;
LAB_0011cade:
    iVar5 = curl_easy_getinfo(curl,uVar12,&local_50);
    if (iVar5 != 0) goto switchD_0011c900_default;
    pcVar11 = "%.0f";
    goto LAB_0011cb64;
  case VAR_SPEED_DOWNLOAD:
    uVar12 = 0x300009;
    goto LAB_0011cb48;
  case VAR_SPEED_UPLOAD:
    uVar12 = 0x30000a;
LAB_0011cb48:
    iVar5 = curl_easy_getinfo(curl,uVar12,&local_50);
    if (iVar5 != 0) goto switchD_0011c900_default;
    pcVar11 = "%.3f";
    goto LAB_0011cb64;
  case VAR_HTTP_CODE:
    uVar12 = 0x200002;
    goto LAB_0011cb1b;
  case VAR_HTTP_CODE_PROXY:
    uVar12 = 0x200016;
LAB_0011cb1b:
    iVar5 = curl_easy_getinfo(curl,uVar12,&local_48);
    if (iVar5 != 0) goto switchD_0011c900_default;
    pcVar11 = "%03ld";
    pbVar10 = local_48;
    goto LAB_0011cc71;
  case VAR_HEADER_SIZE:
    uVar12 = 0x20000b;
    break;
  case VAR_REQUEST_SIZE:
    uVar12 = 0x20000c;
    break;
  case VAR_EFFECTIVE_URL:
    uVar12 = 0x100001;
    goto LAB_0011cbbc;
  case VAR_CONTENT_TYPE:
    uVar12 = 0x100012;
    goto LAB_0011cbbc;
  case VAR_NUM_CONNECTS:
    uVar12 = 0x20001a;
    break;
  case VAR_REDIRECT_TIME:
    uVar12 = 0x300013;
LAB_0011ca8c:
    iVar5 = curl_easy_getinfo(curl,uVar12,&local_50);
    if (iVar5 == 0) {
      pcVar11 = "%.6f";
LAB_0011cb64:
      curl_mfprintf(local_50,__stream,pcVar11);
    }
    goto switchD_0011c900_default;
  case VAR_REDIRECT_COUNT:
    uVar12 = 0x200014;
    break;
  case VAR_FTP_ENTRY_PATH:
    uVar12 = 0x10001e;
    goto LAB_0011cbbc;
  case VAR_REDIRECT_URL:
    uVar12 = 0x10001f;
LAB_0011cbbc:
    iVar5 = curl_easy_getinfo(curl,uVar12,&local_40);
    if (local_40 != (byte *)0x0 && iVar5 == 0) {
      fputs((char *)local_40,__stream);
    }
    goto switchD_0011c900_default;
  case VAR_SSL_VERIFY_RESULT:
    uVar12 = 0x20000d;
    break;
  case VAR_PROXY_SSL_VERIFY_RESULT:
    uVar12 = 0x20002f;
    break;
  case VAR_EFFECTIVE_FILENAME:
    pbVar10 = (byte *)local_38->filename;
    if ((byte *)local_38->filename == (byte *)0x0) goto switchD_0011c900_default;
    goto LAB_0011cc67;
  case VAR_PRIMARY_IP:
    uVar12 = 0x100020;
    goto LAB_0011cc57;
  case VAR_PRIMARY_PORT:
    uVar12 = 0x200028;
    break;
  case VAR_LOCAL_IP:
    uVar12 = 0x100029;
    goto LAB_0011cc57;
  case VAR_LOCAL_PORT:
    uVar12 = 0x20002a;
    break;
  case VAR_HTTP_VERSION:
    iVar5 = curl_easy_getinfo(curl,0x20002e,&local_48);
    if (iVar5 == 0) {
      pcVar11 = "0";
      if ((long)local_48 < 3) {
        if (local_48 == (byte *)0x1) {
          pcVar11 = "1.0";
        }
        else if (local_48 == (byte *)0x2) {
          pcVar11 = "1.1";
        }
      }
      else if (local_48 == (byte *)0x3) {
        pcVar11 = "2";
      }
      else if (local_48 == (byte *)0x1e) {
        pcVar11 = "3";
      }
      curl_mfprintf(__stream,pcVar11);
    }
    goto switchD_0011c900_default;
  case VAR_SCHEME:
    uVar12 = 0x100031;
LAB_0011cc57:
    iVar5 = curl_easy_getinfo(curl,uVar12,&local_40);
    pbVar10 = local_40;
    if (iVar5 != 0) goto switchD_0011c900_default;
LAB_0011cc67:
    pcVar11 = "%s";
    goto LAB_0011cc71;
  case VAR_STDOUT:
    puVar7 = (undefined8 *)&stdout;
    goto LAB_0011cb7a;
  case VAR_STDERR:
    puVar7 = (undefined8 *)&stderr;
LAB_0011cb7a:
    __stream = (FILE *)*puVar7;
  default:
    goto switchD_0011c900_default;
  }
  iVar5 = curl_easy_getinfo(curl,uVar12,&local_48);
  if (iVar5 == 0) {
    pcVar11 = "%ld";
    pbVar10 = local_48;
LAB_0011cc71:
    curl_mfprintf(pFVar13,pcVar11,pbVar10);
  }
switchD_0011c900_default:
  writeinfo = pcVar6 + 1;
  *pcVar6 = cVar3;
  goto LAB_0011c7dc;
}

Assistant:

void ourWriteOut(CURL *curl, struct OutStruct *outs, const char *writeinfo)
{
  FILE *stream = stdout;
  const char *ptr = writeinfo;
  char *stringp = NULL;
  long longinfo;
  double doubleinfo;

  while(ptr && *ptr) {
    if('%' == *ptr && ptr[1]) {
      if('%' == ptr[1]) {
        /* an escaped %-letter */
        fputc('%', stream);
        ptr += 2;
      }
      else {
        /* this is meant as a variable to output */
        char *end;
        if('{' == ptr[1]) {
          char keepit;
          int i;
          bool match = FALSE;
          end = strchr(ptr, '}');
          ptr += 2; /* pass the % and the { */
          if(!end) {
            fputs("%{", stream);
            continue;
          }
          keepit = *end;
          *end = 0; /* zero terminate */
          for(i = 0; replacements[i].name; i++) {
            if(curl_strequal(ptr, replacements[i].name)) {
              match = TRUE;
              switch(replacements[i].id) {
              case VAR_EFFECTIVE_URL:
                if((CURLE_OK ==
                    curl_easy_getinfo(curl, CURLINFO_EFFECTIVE_URL, &stringp))
                   && stringp)
                  fputs(stringp, stream);
                break;
              case VAR_HTTP_CODE:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &longinfo))
                  fprintf(stream, "%03ld", longinfo);
                break;
              case VAR_HTTP_CODE_PROXY:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_HTTP_CONNECTCODE,
                                     &longinfo))
                  fprintf(stream, "%03ld", longinfo);
                break;
              case VAR_HEADER_SIZE:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_HEADER_SIZE, &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_REQUEST_SIZE:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_REQUEST_SIZE, &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_NUM_CONNECTS:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_NUM_CONNECTS, &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_REDIRECT_COUNT:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_REDIRECT_COUNT, &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_REDIRECT_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_REDIRECT_TIME,
                                     &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_TOTAL_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_TOTAL_TIME, &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_NAMELOOKUP_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_NAMELOOKUP_TIME,
                                     &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_CONNECT_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_CONNECT_TIME, &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_APPCONNECT_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_APPCONNECT_TIME,
                                     &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_PRETRANSFER_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_PRETRANSFER_TIME,
                                     &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_STARTTRANSFER_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_STARTTRANSFER_TIME,
                                     &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_SIZE_UPLOAD:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SIZE_UPLOAD, &doubleinfo))
                  fprintf(stream, "%.0f", doubleinfo);
                break;
              case VAR_SIZE_DOWNLOAD:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SIZE_DOWNLOAD,
                                     &doubleinfo))
                  fprintf(stream, "%.0f", doubleinfo);
                break;
              case VAR_SPEED_DOWNLOAD:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SPEED_DOWNLOAD,
                                     &doubleinfo))
                  fprintf(stream, "%.3f", doubleinfo);
                break;
              case VAR_SPEED_UPLOAD:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SPEED_UPLOAD, &doubleinfo))
                  fprintf(stream, "%.3f", doubleinfo);
                break;
              case VAR_CONTENT_TYPE:
                if((CURLE_OK ==
                    curl_easy_getinfo(curl, CURLINFO_CONTENT_TYPE, &stringp))
                   && stringp)
                  fputs(stringp, stream);
                break;
              case VAR_FTP_ENTRY_PATH:
                if((CURLE_OK ==
                    curl_easy_getinfo(curl, CURLINFO_FTP_ENTRY_PATH, &stringp))
                   && stringp)
                  fputs(stringp, stream);
                break;
              case VAR_REDIRECT_URL:
                if((CURLE_OK ==
                    curl_easy_getinfo(curl, CURLINFO_REDIRECT_URL, &stringp))
                   && stringp)
                  fputs(stringp, stream);
                break;
              case VAR_SSL_VERIFY_RESULT:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SSL_VERIFYRESULT,
                                     &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_PROXY_SSL_VERIFY_RESULT:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_PROXY_SSL_VERIFYRESULT,
                                     &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_EFFECTIVE_FILENAME:
                if(outs->filename)
                  fprintf(stream, "%s", outs->filename);
                break;
              case VAR_PRIMARY_IP:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_PRIMARY_IP,
                                     &stringp))
                  fprintf(stream, "%s", stringp);
                break;
              case VAR_PRIMARY_PORT:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_PRIMARY_PORT,
                                     &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_LOCAL_IP:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_LOCAL_IP,
                                     &stringp))
                  fprintf(stream, "%s", stringp);
                break;
              case VAR_LOCAL_PORT:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_LOCAL_PORT,
                                     &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_HTTP_VERSION:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_HTTP_VERSION,
                                     &longinfo)) {
                  const char *version = "0";
                  switch(longinfo) {
                  case CURL_HTTP_VERSION_1_0:
                    version = "1.0";
                    break;
                  case CURL_HTTP_VERSION_1_1:
                    version = "1.1";
                    break;
                  case CURL_HTTP_VERSION_2_0:
                    version = "2";
                    break;
                  case CURL_HTTP_VERSION_3:
                    version = "3";
                    break;
                  }

                  fprintf(stream, version);
                }
                break;
              case VAR_SCHEME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SCHEME,
                                     &stringp))
                  fprintf(stream, "%s", stringp);
                break;
              case VAR_STDOUT:
                stream = stdout;
                break;
              case VAR_STDERR:
                stream = stderr;
                break;
              default:
                break;
              }
              break;
            }
          }
          if(!match) {
            fprintf(stderr, "curl: unknown --write-out variable: '%s'\n", ptr);
          }
          ptr = end + 1; /* pass the end */
          *end = keepit;
        }
        else {
          /* illegal syntax, then just output the characters that are used */
          fputc('%', stream);
          fputc(ptr[1], stream);
          ptr += 2;
        }
      }
    }
    else if('\\' == *ptr && ptr[1]) {
      switch(ptr[1]) {
      case 'r':
        fputc('\r', stream);
        break;
      case 'n':
        fputc('\n', stream);
        break;
      case 't':
        fputc('\t', stream);
        break;
      default:
        /* unknown, just output this */
        fputc(*ptr, stream);
        fputc(ptr[1], stream);
        break;
      }
      ptr += 2;
    }
    else {
      fputc(*ptr, stream);
      ptr++;
    }
  }

}